

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::aspect_mask_is_supported(Impl *this,VkImageAspectFlags aspect)

{
  size_type sVar1;
  bool bVar2;
  allocator local_39;
  key_type local_38;
  
  bVar2 = false;
  if ((aspect < 0x800) &&
     (bVar2 = false, (this->features).maintenance4.maintenance4 != 0 || aspect != 0)) {
    if (((aspect & 0x70) == 0) || ((this->features).ycbcr_conversion.samplerYcbcrConversion != 0)) {
      bVar2 = true;
      if (0x7f < aspect) {
        std::__cxx11::string::string
                  ((string *)&local_38,"VK_EXT_image_drm_format_modifier",&local_39);
        sVar1 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)this,&local_38);
        bVar2 = sVar1 != 0;
        std::__cxx11::string::_M_dispose();
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool FeatureFilter::Impl::aspect_mask_is_supported(VkImageAspectFlags aspect) const
{
	if (aspect == VK_IMAGE_ASPECT_NONE && features.maintenance4.maintenance4 == VK_FALSE)
		return false;

	constexpr VkImageAspectFlags supported_flags =
			VK_IMAGE_ASPECT_COLOR_BIT |
			VK_IMAGE_ASPECT_DEPTH_BIT |
			VK_IMAGE_ASPECT_STENCIL_BIT |
			VK_IMAGE_ASPECT_METADATA_BIT |
			VK_IMAGE_ASPECT_PLANE_0_BIT |
			VK_IMAGE_ASPECT_PLANE_1_BIT |
			VK_IMAGE_ASPECT_PLANE_2_BIT |
			VK_IMAGE_ASPECT_MEMORY_PLANE_0_BIT_EXT |
			VK_IMAGE_ASPECT_MEMORY_PLANE_1_BIT_EXT |
			VK_IMAGE_ASPECT_MEMORY_PLANE_2_BIT_EXT |
			VK_IMAGE_ASPECT_MEMORY_PLANE_3_BIT_EXT;

	if (aspect & ~supported_flags)
		return false;

	if ((aspect & (VK_IMAGE_ASPECT_PLANE_0_BIT |
	               VK_IMAGE_ASPECT_PLANE_1_BIT |
	               VK_IMAGE_ASPECT_PLANE_2_BIT)) != 0 &&
	    features.ycbcr_conversion.samplerYcbcrConversion == VK_FALSE)
		return false;

	if ((aspect & (VK_IMAGE_ASPECT_MEMORY_PLANE_0_BIT_EXT |
	               VK_IMAGE_ASPECT_MEMORY_PLANE_1_BIT_EXT |
	               VK_IMAGE_ASPECT_MEMORY_PLANE_2_BIT_EXT |
	               VK_IMAGE_ASPECT_MEMORY_PLANE_3_BIT_EXT)) != 0 &&
	    enabled_extensions.count(VK_EXT_IMAGE_DRM_FORMAT_MODIFIER_EXTENSION_NAME) == 0)
		return false;

	return true;
}